

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

void __thiscall Image::save(Image *this,string *file_name)

{
  ostream *poVar1;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  ofstream out;
  
  std::ofstream::ofstream((ostream *)&out,(string *)file_name,_S_bin);
  poVar1 = std::operator<<((ostream *)&out,"P6 ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0xff);
  std::operator<<(poVar1,"\n");
  sVar3 = this->height;
  lVar2 = sVar3 * 3;
  while( true ) {
    lVar2 = lVar2 + -3;
    bVar4 = sVar3 == 0;
    sVar3 = sVar3 - 1;
    if (bVar4) break;
    std::ostream::write((char *)&out,
                        (long)((this->data)._M_t.
                               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                               .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                              this->width * lVar2));
  }
  std::ofstream::~ofstream(&out);
  return;
}

Assistant:

void save(const std::string& file_name) {
        std::ofstream out(file_name, std::ofstream::binary);
        out << "P6 " << width << " " << height << " " << 255 << "\n";
        for (size_t j = height; j > 0; --j)
            out.write(reinterpret_cast<char*>(data.get() + (j - 1) * 3 * width), sizeof(uint8_t) * 3 * width);
    }